

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Shader.cpp
# Opt level: O1

void __thiscall nite::Shader::Shader(Shader *this,string *frag,string *vert)

{
  (this->shaderName)._M_dataplus._M_p = (pointer)&(this->shaderName).field_2;
  (this->shaderName)._M_string_length = 0;
  (this->shaderName).field_2._M_local_buf[0] = '\0';
  (this->fragFilename)._M_dataplus._M_p = (pointer)&(this->fragFilename).field_2;
  (this->fragFilename)._M_string_length = 0;
  (this->fragFilename).field_2._M_local_buf[0] = '\0';
  (this->vertFilename)._M_dataplus._M_p = (pointer)&(this->vertFilename).field_2;
  (this->vertFilename)._M_string_length = 0;
  (this->vertFilename).field_2._M_local_buf[0] = '\0';
  this->id = -1;
  load(this,frag,vert);
  return;
}

Assistant:

nite::Shader::Shader(const String &frag, const String &vert){
	id = -1;
	load(frag, vert);
}